

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int begin_get_handle_max(BEGIN_HANDLE begin,handle *handle_max_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  
  item_count = (uint32_t)((ulong)in_RAX >> 0x20);
  if (begin == (BEGIN_HANDLE)0x0) {
    return 0xb9f;
  }
  iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,&item_count);
  if (iVar1 != 0) {
    return 0xba7;
  }
  if (((4 < item_count) &&
      (value = amqpvalue_get_composite_item_in_place(begin->composite_value,4),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_uint(value,handle_max_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0xbc0;
    }
  }
  *handle_max_value = 0xffffffff;
  return 0;
}

Assistant:

int begin_get_handle_max(BEGIN_HANDLE begin, handle* handle_max_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                *handle_max_value = 4294967295u;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *handle_max_value = 4294967295u;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_handle(item_value, handle_max_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *handle_max_value = 4294967295u;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}